

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O1

NodeRange __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::
AddConstraintAndTryNoteResultVariable<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
           *this,CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>
                 *con)

{
  BasicConstraintKeeper *this_00;
  int var;
  int iVar1;
  Error *this_01;
  pair<std::__detail::_Node_iterator<std::pair<const_std::reference_wrapper<const_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>,_int>,_false,_true>,_bool>
  pVar2;
  NodeRange NVar3;
  ConInfo ci;
  ConInfo local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  var = (con->super_FunctionalConstraint).result_var_;
  this_00 = (BasicConstraintKeeper *)(this + 0x3680);
  iVar1 = ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>>
          ::
          AddConstraint<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>>
                    ((ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>>
                      *)this_00,*(int *)(this + 0xb30),con);
  local_50.pck_ = this_00;
  local_50.index_ = iVar1;
  if (-1 < var) {
    FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
    ::AddInitExpression((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                         *)this,var,&local_50);
  }
  local_40._M_dataplus._M_p =
       (pointer)std::
                _Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_*>
                ::operator[]((_Deque_iterator<mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_&,_mp::ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomFunctionalConstraint<std::array<int,_3UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::ImplicationId>_>::Container_*>
                              *)(this + 0x3760),(long)iVar1);
  local_40._M_string_length._0_4_ = iVar1;
  pVar2 = std::
          _Hashtable<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>,std::pair<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>const,int>,std::allocator<std::pair<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>const,int>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>>,std::hash<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_emplace<std::pair<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>const,int>>
                    ((_Hashtable<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>,std::pair<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>const,int>,std::allocator<std::pair<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>const,int>>,std::__detail::_Select1st,std::equal_to<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>>,std::hash<std::reference_wrapper<mp::CustomFunctionalConstraint<std::array<int,3ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::ImplicationId>const>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)(this + 0x37d0));
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if (iVar1 < 0) {
      iVar1 = *(int *)(this + 0x36d8) + iVar1;
    }
    if (*(int *)(this + 0x36d8) <= iVar1) {
      *(long *)(this + 0x36d8) = (long)(iVar1 + 1);
    }
    NVar3.ir_.end_ = iVar1 + 1;
    NVar3.ir_.beg_ = iVar1;
    NVar3.pvn_ = (ValueNode *)(this + 0x3688);
    return NVar3;
  }
  this_01 = (Error *)__cxa_allocate_exception(0x18);
  std::operator+(&local_40,"Trying to MapInsert() duplicated constraint: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (this + 0x37b0));
  Error::Error(this_01,(CStringRef)local_40._M_dataplus._M_p,-1);
  __cxa_throw(this_01,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

pre::NodeRange AddConstraintAndTryNoteResultVariable(Constraint&& con) {
    const auto resvar = con.GetResultVar();
    auto& ck = GET_CONSTRAINT_KEEPER( Constraint );
    auto i = ck.AddConstraint(constr_depth_, std::move(con));
    ConInfo ci{&ck, i};
    if (resvar>=0)
      AddInitExpression(resvar, ci);
    /// Can also cache non-functional constraints,
    /// but then implement checking before
    if (! MP_DISPATCH( MapInsert(
                         MPD(template GetConstraint<Constraint>(i)), i ) ))
      MP_RAISE("Trying to MapInsert() duplicated constraint: " +
                             ck.GetDescription());
    return ck.SelectValueNodeRange(i);
  }